

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

result_type __thiscall
WellTestCase<Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<-24>,_Detail::M3<30>,_Detail::M3<-10>,_Detail::M2<-26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::MatsumotoKuritaTempering<2480739328U,_4195450880U>_>,_2483442811U>
::generate(WellTestCase<Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<_24>,_Detail::M3<30>,_Detail::M3<_10>,_Detail::M2<_26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::MatsumotoKuritaTempering<2480739328U,_4195450880U>_>,_2483442811U>
           *this)

{
  result_type rVar1;
  long lVar2;
  int iVar3;
  uint *p;
  uint state [1391];
  uint *local_15e0;
  uint local_15d8 [1394];
  
  for (lVar2 = 0; lVar2 != 0x15bc; lVar2 = lVar2 + 4) {
    *(undefined4 *)((long)local_15d8 + lVar2) = 1;
  }
  local_15e0 = local_15d8;
  Well<unsigned_int,32ul,1391ul,15ul,23ul,481ul,229ul,Detail::M3<-24>,Detail::M3<30>,Detail::M3<-10>,Detail::M2<-26>,Detail::M1,Detail::M3<20>,Detail::M6<32ul,9u,3072982252u,4227858431u,131072u>,Detail::M1,Detail::MatsumotoKuritaTempering<2480739328u,4195450880u>>
  ::seed<unsigned_int*>
            ((Well<unsigned_int,32ul,1391ul,15ul,23ul,481ul,229ul,Detail::M3<_24>,Detail::M3<30>,Detail::M3<_10>,Detail::M2<_26>,Detail::M1,Detail::M3<20>,Detail::M6<32ul,9u,3072982252u,4227858431u,131072u>,Detail::M1,Detail::MatsumotoKuritaTempering<2480739328u,4195450880u>>
              *)this,&local_15e0,local_15d8 + 0x56f);
  rVar1 = 0;
  for (iVar3 = -1000000000; iVar3 != 0; iVar3 = iVar3 + 1) {
    rVar1 = Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<-24>,_Detail::M3<30>,_Detail::M3<-10>,_Detail::M2<-26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::MatsumotoKuritaTempering<2480739328U,_4195450880U>_>
            ::operator()(&this->rng);
  }
  return rVar1;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, RandomNumberGenerator::state_size, 1);

        unsigned* p = state;
        rng.seed(p, p + RandomNumberGenerator::state_size);

        result_type x = 0;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }